

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergeFrom
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  LogMessage *other;
  Version *pVVar4;
  undefined8 *puVar5;
  Arena *arena;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x344);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
             &(from->file_to_generate_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
            (&(this->proto_file_).super_RepeatedPtrFieldBase,
             &(from->proto_file_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->parameter_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar5 = (undefined8 *)*puVar5;
      }
      internal::ArenaStringPtr::Set(&this->parameter_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar5);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->compiler_version_ == (Version *)0x0) {
        uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        arena = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          arena = *(Arena **)arena;
        }
        pVVar4 = Arena::CreateMaybeMessage<google::protobuf::compiler::Version>(arena);
        this->compiler_version_ = pVVar4;
      }
      pVVar4 = (Version *)_Version_default_instance_;
      if (from->compiler_version_ != (Version *)0x0) {
        pVVar4 = from->compiler_version_;
      }
      Version::MergeFrom(this->compiler_version_,pVVar4);
    }
  }
  uVar3 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void CodeGeneratorRequest::MergeFrom(const CodeGeneratorRequest& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorRequest)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  file_to_generate_.MergeFrom(from.file_to_generate_);
  proto_file_.MergeFrom(from.proto_file_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_parameter(from._internal_parameter());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_compiler_version()->::PROTOBUF_NAMESPACE_ID::compiler::Version::MergeFrom(from._internal_compiler_version());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}